

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_micro.c
# Opt level: O2

void * worker_thread_put(void *arg)

{
  FILE *__stream;
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  ulong uVar4;
  double dVar5;
  undefined1 local_60 [8];
  benchmark_time_t t2;
  benchmark_time_t tdiff;
  benchmark_time_t t1;
  
  uVar4 = (ulong)(uint)(*(int *)((long)arg + 0x1c) * *arg);
  benchmark_time_get((benchmark_time_t *)&tdiff.tv_nsec);
  t1.tv_nsec = uVar4;
  while( true ) {
    if (*(uint *)((long)arg + 0x1c) + uVar4 <= (ulong)t1.tv_nsec) {
      benchmark_time_get((benchmark_time_t *)local_60);
      benchmark_time_diff((benchmark_time_t *)&t2.tv_nsec,(benchmark_time_t *)&tdiff.tv_nsec,
                          (benchmark_time_t *)local_60);
      dVar5 = benchmark_time_get_secs((benchmark_time_t *)&t2.tv_nsec);
      *(double *)((long)arg + 0x20) = dVar5;
      return (void *)0x0;
    }
    lVar3 = ((ulong)t1.tv_nsec % (ulong)*(uint *)((long)arg + 0x18)) * 0x10;
    iVar1 = vmemcache_put(*(undefined8 *)((long)arg + 8),&t1.tv_nsec,8,
                          *(undefined8 *)(*(long *)((long)arg + 0x10) + 8 + lVar3),
                          *(undefined8 *)(*(long *)((long)arg + 0x10) + lVar3));
    if (iVar1 != 0) break;
    t1.tv_nsec = t1.tv_nsec + 1;
  }
  fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
          "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/benchmarks/bench_micro.c"
          ,0x5a,"worker_thread_put");
  __stream = _stderr;
  uVar2 = vmemcache_errormsg();
  fprintf(__stream,"ERROR: vmemcache_put: %s",uVar2);
  fputc(10,_stderr);
  abort();
}

Assistant:

static void *
worker_thread_put(void *arg)
{
	struct context *ctx = arg;
	unsigned long long i;
	unsigned long long shift = ctx->thread_number * ctx->ops_count;
	benchmark_time_t t1, t2, tdiff;

	benchmark_time_get(&t1);

	for (i = shift; i < (shift + ctx->ops_count); i++) {
		if (vmemcache_put(ctx->cache, &i, sizeof(i),
				ctx->buffs[i % ctx->nbuffs].buff,
				ctx->buffs[i % ctx->nbuffs].size))
			UT_FATAL("ERROR: vmemcache_put: %s",
					vmemcache_errormsg());
	}

	benchmark_time_get(&t2);
	benchmark_time_diff(&tdiff, &t1, &t2);
	ctx->secs = benchmark_time_get_secs(&tdiff);

	return NULL;
}